

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void s_AddDefineFlag(string *flag,string *dflags)

{
  size_type sVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 in_RAX;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined8 uStack_28;
  
  sVar1 = dflags->_M_string_length;
  uStack_28 = in_RAX;
  std::__cxx11::string::push_back((char)dflags);
  std::__cxx11::string::append((string *)dflags);
  pcVar2 = (dflags->_M_dataplus)._M_p;
  __first._M_current = pcVar2 + sVar1 + 1;
  uStack_28 = CONCAT17(10,CONCAT16(0x20,(undefined6)uStack_28));
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(pcVar2 + dflags->_M_string_length),(char *)((long)&uStack_28 + 7),
             (char *)((long)&uStack_28 + 6));
  uVar3 = uStack_28;
  uStack_28 = CONCAT26(uStack_28._6_2_,0xd0000000000);
  uStack_28._0_5_ = CONCAT14(0x20,(int)uVar3);
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )((dflags->_M_dataplus)._M_p + dflags->_M_string_length),
             (char *)((long)&uStack_28 + 5),(char *)((long)&uStack_28 + 4));
  return;
}

Assistant:

static void s_AddDefineFlag(std::string const& flag, std::string& dflags)
{
  // remove any \n\r
  std::string::size_type initSize = dflags.size();
  dflags += ' ';
  dflags += flag;
  std::string::iterator flagStart = dflags.begin() + initSize + 1;
  std::replace(flagStart, dflags.end(), '\n', ' ');
  std::replace(flagStart, dflags.end(), '\r', ' ');
}